

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O1

void Saig_ObjCexMinSim(Aig_Obj_t *pObj)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = *(ulong *)&pObj->field_0x18;
  uVar4 = (uint)uVar3 & 7;
  if (uVar4 == 3) {
    pAVar1 = pObj->pFanin0;
    uVar4 = (uint)*(undefined8 *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x18) & 0x30;
    if (((uVar4 == 0x20 & (byte)pAVar1) == 0) && (((ulong)pAVar1 & 1) != 0 || uVar4 != 0x10)) {
      if (((uVar4 == 0x10 & (byte)pAVar1) == 0) && (((ulong)pAVar1 & 1) != 0 || uVar4 != 0x20)) {
LAB_00607edb:
        uVar3 = uVar3 | 0x30;
        goto LAB_00607eef;
      }
      uVar3 = uVar3 & 0xffffffffffffffcb;
LAB_00607ef8:
      uVar3 = uVar3 | 0x20;
      goto LAB_00607eef;
    }
    uVar3 = uVar3 & 0xffffffffffffffcb;
  }
  else {
    if (uVar4 != 5) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                    ,0x26e,"void Saig_ObjCexMinSim(Aig_Obj_t *)");
    }
    pAVar1 = pObj->pFanin0;
    uVar4 = (uint)*(undefined8 *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x18) & 0x30;
    if (((uVar4 == 0x20 & (byte)pAVar1) == 0) && (((ulong)pAVar1 & 1) != 0 || uVar4 != 0x10)) {
      pAVar2 = pObj->pFanin1;
      uVar5 = (uint)*(undefined8 *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x18) & 0x30;
      if (((uVar5 == 0x20 & (byte)pAVar2) == 0) && (((ulong)pAVar2 & 1) != 0 || uVar5 != 0x10)) {
        if ((((uVar4 == 0x10 & (byte)pAVar1) == 0) && (((ulong)pAVar1 & 1) != 0 || uVar4 != 0x20))
           || (((uVar5 == 0x10 & (byte)pAVar2) == 0 && (((ulong)pAVar2 & 1) != 0 || uVar5 != 0x20)))
           ) goto LAB_00607edb;
        uVar3 = uVar3 & 0xffffffffffffffcd;
        goto LAB_00607ef8;
      }
    }
    uVar3 = uVar3 & 0xffffffffffffffcd;
  }
  uVar3 = uVar3 | 0x10;
LAB_00607eef:
  *(ulong *)&pObj->field_0x18 = uVar3;
  return;
}

Assistant:

static inline int          Aig_ObjIsAnd( Aig_Obj_t * pObj )       { return pObj->Type == AIG_OBJ_AND;    }